

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall
camp::NotEnoughArguments::NotEnoughArguments
          (NotEnoughArguments *this,string *functionName,size_t provided,size_t expected)

{
  undefined1 local_118 [32];
  undefined1 local_f8 [80];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  size_t local_28;
  size_t expected_local;
  size_t provided_local;
  string *functionName_local;
  NotEnoughArguments *this_local;
  
  local_28 = expected;
  expected_local = provided;
  provided_local = (size_t)functionName;
  functionName_local = (string *)this;
  std::operator+(local_f8 + 0x30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "not enough arguments for calling ");
  std::operator+(local_a8,local_f8 + 0x30);
  Error::str<unsigned_long>((Error *)local_f8,expected_local);
  std::operator+(local_88,local_a8);
  std::operator+(local_68,(char *)local_88);
  Error::str<unsigned_long>((Error *)local_118,local_28);
  std::operator+(local_48,local_68);
  Error::Error(&this->super_Error,local_48);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)(local_f8 + 0x30));
  *(undefined ***)&this->super_Error = &PTR__NotEnoughArguments_001fd538;
  return;
}

Assistant:

NotEnoughArguments::NotEnoughArguments(const std::string& functionName, std::size_t provided, std::size_t expected)
    : Error("not enough arguments for calling " + functionName + " - provided " + str(provided) + ", expected " + str(expected))
{
}